

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.cpp
# Opt level: O0

string * __thiscall
pstore::http::ws_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,ws_error_category *this,int error)

{
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [16];
  allocator local_1d;
  int local_1c;
  ws_error_category *pwStack_18;
  int error_local;
  ws_error_category *this_local;
  
  local_1c = error;
  pwStack_18 = this;
  this_local = (ws_error_category *)__return_storage_ptr__;
  switch(error) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "One of a client frame\'s reserved bits was unexpectedly set",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"The frame\'s payload length was too large",local_2d
              );
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"The client sent an unmasked frame",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Message too long",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Insufficient data was received",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Unknown error",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

auto ws_error_category::message (int const error) const -> std::string {
            switch (static_cast<ws_error> (error)) {
            case ws_error::reserved_bit_set:
                return "One of a client frame's reserved bits was unexpectedly set";
            case ws_error::payload_too_long: return "The frame's payload length was too large";
            case ws_error::unmasked_frame: return "The client sent an unmasked frame";
            case ws_error::message_too_long: return "Message too long";
            case ws_error::insufficient_data: return "Insufficient data was received";
            }
            return "Unknown error";
        }